

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dgList.h
# Opt level: O2

dgListNode * __thiscall
dgList<dgList<dgConvexHull3DFace>::dgListNode_*>::Append
          (dgList<dgList<dgConvexHull3DFace>::dgListNode_*> *this,dgListNode **element)

{
  dgListNode *pdVar1;
  dgListNode *this_00;
  
  this->m_count = this->m_count + 1;
  pdVar1 = this->m_first;
  this_00 = (dgListNode *)malloc(0x20);
  if (pdVar1 == (dgListNode *)0x0) {
    this_00->_vptr_dgListNode = (_func_int **)&PTR__dgListNode_0118ea08;
    this_00->m_info = *element;
    this_00->m_next = (dgListNode *)0x0;
    this_00->m_prev = (dgListNode *)0x0;
    this->m_first = this_00;
  }
  else {
    dgListNode::dgListNode(this_00,element,this->m_last,(dgListNode *)0x0);
  }
  this->m_last = this_00;
  return this_00;
}

Assistant:

typename dgList<T>::dgListNode *dgList<T>::Append (const T &element)
{
	m_count	++;
	if (m_first == NULL) {
		m_first = HACD_NEW(dgListNode)(element, NULL, NULL);
		m_last = m_first;
	} else {
		m_last = HACD_NEW(dgListNode)(element, m_last, NULL);
	}
#ifdef __ENABLE_SANITY_CHECK 
	HACD_ASSERT (SanityCheck ());
#endif

	return m_last;
}